

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::removeSatisfied(Solver *this,vec<unsigned_int,_int> *cs)

{
  byte bVar1;
  lbool *plVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  anon_struct_4_5_613047fb_for_header *c;
  Size nelems;
  long lVar10;
  
  if (cs->sz < 1) {
    nelems = 0;
  }
  else {
    lVar10 = 0;
    iVar9 = 0;
    do {
      if ((this->ca).ra.sz <= cs->data[lVar10]) {
        __assert_fail("r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                      ,0x3f,
                      "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                     );
      }
      c = (anon_struct_4_5_613047fb_for_header *)((this->ca).ra.memory + cs->data[lVar10]);
      bVar3 = satisfied(this,(Clause *)c);
      if (bVar3) {
        removeClause(this,cs->data[lVar10]);
      }
      else {
        iVar5 = (int)c[1] >> 1;
        iVar8 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map
                .sz;
        if (iVar8 <= iVar5) {
LAB_0010bfd7:
          __assert_fail("has(k)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                        ,0x27,
                        "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                       );
        }
        plVar2 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                 map.data;
        bVar1 = plVar2[iVar5].value;
        bVar4 = l_Undef & 2;
        if (((SUB41(c[1],0) & 1 ^ bVar1) != l_Undef || bVar4 != 0) && (bVar1 & bVar4) == 0) {
LAB_0010bff6:
          __assert_fail("value(c[0]) == l_Undef && value(c[1]) == l_Undef",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                        ,0x262,"void Minisat::Solver::removeSatisfied(vec<CRef> &)");
        }
        iVar5 = (int)c[2] >> 1;
        if (iVar8 <= iVar5) goto LAB_0010bfd7;
        bVar1 = plVar2[iVar5].value;
        if (((SUB41(c[2],0) & 1 ^ bVar1) != l_Undef || bVar4 != 0) && (bVar4 & bVar1) == 0)
        goto LAB_0010bff6;
        if (0x5f < (uint)*c) {
          uVar6 = (uint)*c >> 5;
          iVar8 = 2;
          do {
            iVar5 = (int)c[(long)iVar8 + 1] >> 1;
            if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map
                .sz <= iVar5) goto LAB_0010bfd7;
            bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>
                    .map.data[iVar5].value;
            iVar5 = iVar8;
            if ((SUB41(c[(long)iVar8 + 1],0) & 1 ^ bVar1) == l_False && (l_False & 2) == 0 ||
                (l_False & 2 & bVar1) != 0) {
              iVar5 = iVar8 + -1;
              c[(long)iVar8 + 1] = c[(int)uVar6];
              Clause::shrink((Clause *)c,1);
            }
            iVar8 = iVar5 + 1;
            uVar6 = (uint)*c >> 5;
          } while (iVar8 < (int)uVar6);
        }
        lVar7 = (long)iVar9;
        iVar9 = iVar9 + 1;
        cs->data[lVar7] = cs->data[lVar10];
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < cs->sz);
    nelems = (int)lVar10 - iVar9;
  }
  vec<unsigned_int,_int>::shrink(cs,nelems);
  return;
}

Assistant:

void Solver::removeSatisfied(vec<CRef>& cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++){
        Clause& c = ca[cs[i]];
        if (satisfied(c))
            removeClause(cs[i]);
        else{
            // Trim clause:
            assert(value(c[0]) == l_Undef && value(c[1]) == l_Undef);
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) == l_False){
                    c[k--] = c[c.size()-1];
                    c.pop();
                }
            cs[j++] = cs[i];
        }
    }
    cs.shrink(i - j);
}